

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::toString_abi_cxx11_(string *__return_storage_ptr__,Catch *this,char value)

{
  undefined7 in_register_00000011;
  allocator *paVar1;
  char *pcVar2;
  char chstr [4];
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  char local_c;
  byte bStack_b;
  undefined2 uStack_a;
  
  switch((int)this) {
  case 9:
    pcVar2 = "\'\\t\'";
    paVar1 = &local_10;
    break;
  case 10:
    pcVar2 = "\'\\n\'";
    paVar1 = &local_f;
    break;
  default:
    if ((byte)this < 0x20) {
      toString_abi_cxx11_(__return_storage_ptr__,(Catch *)(long)(int)this,
                          CONCAT71(in_register_00000011,value));
      return __return_storage_ptr__;
    }
    pcVar2 = &local_c;
    _local_c = CONCAT22(0x27,CONCAT11((byte)this,0x27));
    paVar1 = &local_11;
    break;
  case 0xc:
    pcVar2 = "\'\\f\'";
    paVar1 = &local_e;
    break;
  case 0xd:
    pcVar2 = "\'\\r\'";
    paVar1 = &local_d;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string toString( char value ) {
    if ( value == '\r' )
        return "'\\r'";
    if ( value == '\f' )
        return "'\\f'";
    if ( value == '\n' )
        return "'\\n'";
    if ( value == '\t' )
        return "'\\t'";
    if ( '\0' <= value && value < ' ' )
        return toString( static_cast<unsigned int>( value ) );
    char chstr[] = "' '";
    chstr[1] = value;
    return chstr;
}